

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveComments.cpp
# Opt level: O2

void Assimp::CommentRemover::RemoveLineComments(char *szComment,char *szBuffer,char chReplacement)

{
  byte bVar1;
  int iVar2;
  size_t __n;
  
  if (((szComment == (char *)0x0) || (szBuffer == (char *)0x0)) || (*szComment == '\0')) {
    __assert_fail("__null != szComment && __null != szBuffer && *szComment",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Common/RemoveComments.cpp"
                  ,0x3a,
                  "static void Assimp::CommentRemover::RemoveLineComments(const char *, char *, char)"
                 );
  }
  __n = strlen(szComment);
  do {
    bVar1 = *szBuffer;
    if ((bVar1 == 0x22) || (bVar1 == 0x27)) {
      while (szBuffer = (char *)((byte *)szBuffer + 1), bVar1 != 0) {
        bVar1 = *szBuffer;
        if ((bVar1 == 0x27) || (bVar1 == 0x22)) break;
      }
    }
    else if (bVar1 == 0) {
      return;
    }
    iVar2 = strncmp(szBuffer,szComment,__n);
    if (iVar2 == 0) {
      for (; bVar1 = *szBuffer, 1 < bVar1 - 0xc; szBuffer = (char *)((byte *)szBuffer + 1)) {
        if (bVar1 == 0) {
          return;
        }
        if (bVar1 == 10) break;
        *szBuffer = chReplacement;
      }
    }
    szBuffer = (char *)((byte *)szBuffer + 1);
  } while( true );
}

Assistant:

void CommentRemover::RemoveLineComments(const char* szComment,
    char* szBuffer, char chReplacement /* = ' ' */)
{
    // validate parameters
    ai_assert(NULL != szComment && NULL != szBuffer && *szComment);

    const size_t len = strlen(szComment);
    while (*szBuffer)   {

        // skip over quotes
        if (*szBuffer == '\"' || *szBuffer == '\'')
            while (*szBuffer++ && *szBuffer != '\"' && *szBuffer != '\'');

        if (!strncmp(szBuffer,szComment,len)) {
            while (!IsLineEnd(*szBuffer))
                *szBuffer++ = chReplacement;

            if (!*szBuffer) {
                break;
            }
        }
        ++szBuffer;
    }
}